

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O2

void embarrasing_starvation(size_t W)

{
  char *pcVar1;
  code *pcVar2;
  double dVar3;
  FlowBuilder this;
  char extraout_AL;
  char extraout_AL_00;
  TestCaseData *pTVar4;
  long *plVar5;
  Executor *this_00;
  ulong uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  size_t W_local;
  atomic<unsigned_long> barrier;
  size_t B;
  shared_ptr<tf::WorkerInterface> local_418;
  Result local_400;
  ResultBuilder DOCTEST_RB_1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  Executor executor;
  Expression_lhs<const_unsigned_long> local_1f8;
  mutex mutex;
  Taskflow taskflow;
  Taskflow parent;
  
  parent.super_FlowBuilder._graph = (Graph *)&B;
  B = 0x10000;
  executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  executor._notifier._7_2_ = 0x17;
  executor._notifier._waiters.
  super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x17;
  executor._taskflows_mutex.super___mutex_base._M_mutex.__align =
       *(long *)(doctest::detail::g_cs + 0x20);
  executor._taskflows_mutex.super___mutex_base._M_mutex.__data.__owner = 0xc;
  executor._taskflows_mutex.super___mutex_base._M_mutex._16_8_ = anon_var_dwarf_4f812;
  executor._taskflows_mutex.super___mutex_base._M_mutex._24_4_ = 0x1af;
  executor._taskflows_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)anon_var_dwarf_4fa3e;
  executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 1;
  executor._topology_cv = (condition_variable)0x0;
  executor._104_8_ = (long)"TracerPid:\t" + 0xb;
  executor._112_8_ = (long)"TracerPid:\t" + 0xb;
  W_local = W;
  parent._mutex.super___mutex_base._M_mutex.__data.__lock =
       executor._taskflows_mutex.super___mutex_base._M_mutex.__data.__owner;
  doctest::detail::Expression_lhs<const_unsigned_long_&>::operator><unsigned_long,_nullptr>
            ((Result *)&taskflow,(Expression_lhs<const_unsigned_long_&> *)&parent,&W_local);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&executor,(Result *)&taskflow);
  doctest::String::~String((String *)&taskflow._mutex);
  dVar3 = doctest::detail::ResultBuilder::log
                    ((ResultBuilder *)&executor,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da))
  ;
  if (extraout_AL != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&executor);
  doctest::AssertData::~AssertData((AssertData *)&executor);
  tf::Taskflow::Taskflow(&taskflow);
  tf::Taskflow::Taskflow(&parent);
  local_418.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_418.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W_local,&local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_418.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  barrier.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  set._M_h._M_buckets = &set._M_h._M_single_bucket;
  set._M_h._M_bucket_count = 1;
  set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set._M_h._M_element_count = 0;
  set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set._M_h._M_rehash_policy._M_next_resize = 0;
  set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (uVar6 = 0; this._graph = taskflow.super_FlowBuilder._graph, uVar6 < B; uVar6 = uVar6 + 1) {
    pTVar4 = (TestCaseData *)operator_new(0xd8);
    (pTVar4->m_file).field_0.data.ptr = (char *)0x0;
    *(uint **)((long)&(pTVar4->m_file).field_0 + 8) = &pTVar4->m_line;
    *(undefined8 *)((long)&(pTVar4->m_file).field_0 + 0x10) = 0;
    *(undefined1 *)&pTVar4->m_line = 0;
    pcVar1 = (char *)((long)&pTVar4[1].m_file.field_0 + 0x10);
    pTVar4->m_test_suite = (char *)0x0;
    pTVar4->m_description = (char *)0x0;
    pTVar4->m_skip = false;
    pTVar4->m_no_breaks = false;
    pTVar4->m_no_output = false;
    pTVar4->m_may_fail = false;
    pTVar4->m_should_fail = false;
    *(undefined3 *)&pTVar4->field_0x3d = 0;
    *(undefined8 *)&pTVar4->m_expected_failures = 0;
    pTVar4->m_timeout = (double)pcVar1;
    pTVar4[1].m_file.field_0.data.ptr = pcVar1;
    *(char ***)((long)&pTVar4[1].m_file.field_0 + 8) = &pTVar4[1].m_description;
    pTVar4[1].m_description = (char *)0x0;
    pTVar4[1].m_skip = false;
    pTVar4[1].m_no_breaks = false;
    pTVar4[1].m_no_output = false;
    pTVar4[1].m_may_fail = false;
    pTVar4[1].m_should_fail = false;
    *(undefined3 *)&pTVar4[1].field_0x3d = 0;
    *(undefined8 *)&pTVar4[1].m_expected_failures = 0;
    pTVar4[1].m_timeout = 0.0;
    pTVar4[2].m_file.field_0.data.ptr = (char *)0x0;
    plVar5 = (long *)operator_new(0x28);
    *plVar5 = (long)&mutex;
    plVar5[1] = (long)&set;
    plVar5[2] = (long)&executor;
    plVar5[3] = (long)&barrier;
    plVar5[4] = (long)&W_local;
    *(long **)&pTVar4[1].m_skip = plVar5;
    pTVar4[2].m_file.field_0.data.ptr =
         (char *)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:444:22)>
                 ::_M_invoke;
    pTVar4[1].m_timeout =
         (double)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:444:22)>
                 ::_M_manager;
    *(undefined1 *)&pTVar4[2].m_name = 1;
    pTVar4[2].m_test_suite = (char *)0x0;
    pTVar4[2].m_description = (char *)0x0;
    DOCTEST_RB_1.super_AssertData.m_test_case = pTVar4;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)this._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB_1)
    ;
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB_1);
  }
  tf::FlowBuilder::composed_of<tf::Taskflow>((FlowBuilder *)&DOCTEST_RB_1,&parent);
  this_00 = &executor;
  tf::Executor::run((Future<void> *)&DOCTEST_RB_1,this_00,&parent);
  std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB_1,this_00);
  tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB_1);
  DOCTEST_RB_1.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB_1.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB_1.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB_1.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB_1.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB_1.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp"
  ;
  DOCTEST_RB_1.super_AssertData.m_line = 0x1cf;
  DOCTEST_RB_1.super_AssertData.m_expr = "set.size() == W";
  DOCTEST_RB_1.super_AssertData.m_failed = true;
  DOCTEST_RB_1.super_AssertData.m_threw = false;
  DOCTEST_RB_1.super_AssertData.m_threw_as = false;
  DOCTEST_RB_1.super_AssertData.m_exception_type = "";
  DOCTEST_RB_1.super_AssertData.m_exception_string = "";
  local_1f8.lhs = set._M_h._M_element_count;
  local_1f8.m_at = DOCTEST_RB_1.super_AssertData.m_at;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            (&local_400,&local_1f8,&W_local);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB_1,&local_400);
  doctest::String::~String(&local_400.m_decomp);
  dVar3 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB_1,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  if (extraout_AL_00 != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB_1);
  doctest::AssertData::~AssertData(&DOCTEST_RB_1.super_AssertData);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&set._M_h);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&parent);
  tf::Taskflow::~Taskflow(&taskflow);
  return;
}

Assistant:

void embarrasing_starvation(size_t W) {

  size_t B = 65536;

  REQUIRE(B > W);
  
  tf::Taskflow taskflow, parent;
  tf::Executor executor(W);

  std::atomic<size_t> barrier{0};

  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  // fork
  for(size_t b=0; b<B; b++) {
    taskflow.emplace([&](){
      // record worker
      {
        std::scoped_lock lock(mutex);
        set.insert(executor.this_worker_id());
      }

      // all threads should be notified
      barrier.fetch_add(1, std::memory_order_relaxed);
      while(barrier.load(std::memory_order_relaxed) < W) {
        std::this_thread::yield();
      }
    });
  }

  parent.composed_of(taskflow);

  executor.run(parent).wait();

  REQUIRE(set.size() == W);
}